

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl
          (MessageGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  HasbitMode HVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  pointer pFVar8;
  const_reference ppFVar9;
  size_type sVar10;
  LogMessage *pLVar11;
  reference ppFVar12;
  FieldOptions *this_01;
  FieldGenerator *pFVar13;
  uint *puVar14;
  size_t sVar15;
  int extraout_EDX;
  int __c;
  int extraout_EDX_00;
  char *pcVar16;
  anon_class_8_1_8991fb9c *in_R8;
  Options *options;
  Iterator IVar17;
  string_view sVar18;
  string_view prefix;
  string_view s;
  uint in_stack_fffffffffffff634;
  undefined1 in_stack_fffffffffffff638;
  Sub *local_978;
  byte local_7b9;
  basic_string_view<char,_std::char_traits<char>_> local_758;
  basic_string_view<char,_std::char_traits<char>_> local_740;
  undefined1 local_729;
  anon_class_24_3_32f1e682_for_cb local_728;
  allocator<char> local_709;
  string local_708;
  int local_6e8;
  allocator<char> local_6e1;
  string local_6e0;
  string_view local_6c0;
  string local_6b0;
  allocator<char> local_689;
  string local_688;
  string_view local_668;
  allocator<char> local_651;
  string local_650;
  Sub *local_630;
  Sub local_628;
  Sub local_570;
  Sub local_4b8;
  Sub local_400;
  iterator local_348;
  size_type local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_338;
  undefined1 local_328 [8];
  value_type oneof;
  Iterator __end3;
  Iterator __begin3;
  OneOfRangeImpl *__range3;
  basic_string_view<char,_std::char_traits<char>_> local_2e8;
  basic_string_view<char,_std::char_traits<char>_> local_2d0;
  basic_string_view<char,_std::char_traits<char>_> local_2b8;
  undefined1 local_2a1;
  LogMessage local_2a0;
  Voidify local_289;
  anon_class_16_2_0454c2e6 local_288;
  undefined1 local_278 [88];
  int has_bit_index;
  Voidify local_209;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  undefined1 local_1e8 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
  v;
  undefined1 local_1c8 [64];
  FieldGenerator *generator;
  FieldDescriptor *field;
  const_iterator __end5;
  const_iterator __begin5;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range5;
  LogMessage local_148;
  Voidify local_131;
  Nullable<const_char_*> local_130;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_111;
  Nullable<const_char_*> local_110;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  uint32_t chunk_mask;
  bool check_has_byte;
  bool cache_has_bits;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields;
  string local_f0;
  ChunkIterator local_d0;
  ChunkIterator local_c8;
  byte local_b9;
  FieldChunk *pFStack_b8;
  bool has_haswords_check;
  FieldChunk *local_b0;
  __normal_iterator<google::protobuf::compiler::cpp::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>_>
  local_a8;
  ChunkIterator next;
  iterator iStack_98;
  int cached_has_word_index;
  iterator end;
  iterator it;
  undefined1 local_80 [8];
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  chunks;
  basic_string_view<char,_std::char_traits<char>_> local_60 [2];
  undefined1 local_40 [8];
  Formatter format;
  Printer *p_local;
  MessageGenerator *this_local;
  
  format.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)p;
  bVar3 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar3) {
    Formatter::Formatter
              ((Formatter *)local_40,
               (Printer *)
               format.vars_.
               super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.slot_array);
    Formatter::operator()<>
              ((Formatter *)local_40,
               "void $classname$::MergeImpl($pb$::MessageLite& to_msg, const $pb$::MessageLite& from_msg) {\n$WeakDescriptorSelfPin$  auto* const _this = static_cast<$classname$*>(&to_msg);\n  auto& from = static_cast<const $classname$&>(from_msg);\n"
              );
    Formatter::Indent((Formatter *)local_40);
    bVar3 = RequiresArena(this,kMergeFrom);
    uVar2 = format.vars_.
            super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.slot_array;
    if (bVar3) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (local_60,"\n      $pb$::Arena* arena = _this->GetArena();\n    ");
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit((Printer *)uVar2,local_60[0]._M_len,local_60[0]._M_str);
    }
    Formatter::operator()<>
              ((Formatter *)local_40,
               "$annotate_mergefrom$// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n"
              );
    Formatter::operator()<>((Formatter *)local_40,"$DCHK$_NE(&from, _this);\n");
    Formatter::operator()<>
              ((Formatter *)local_40,"$uint32$ cached_has_bits = 0;\n(void) cached_has_bits;\n\n");
    bVar3 = ShouldSplit(this->descriptor_,&this->options_);
    if (bVar3) {
      Formatter::operator()<>
                ((Formatter *)local_40,
                 "if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {\n  _this->PrepareSplitMessageForWrite();\n}\n"
                );
    }
    it._M_current = (FieldChunk *)this;
    CollectFields<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__2>
              ((vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                *)local_80,(cpp *)&this->optimized_order_,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&this->options_,(Options *)&it,in_R8);
    end = std::
          vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
          ::begin((vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                   *)local_80);
    iStack_98 = std::
                vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                ::end((vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                       *)local_80);
    next._M_current._4_4_ = 0xffffffff;
    while (bVar3 = __gnu_cxx::operator!=(&end,&stack0xffffffffffffff68), bVar3) {
      local_b0 = end._M_current;
      pFStack_b8 = iStack_98._M_current;
      local_d0 = FindNextUnequalChunk<bool(google::protobuf::compiler::cpp::FieldChunk_const&,google::protobuf::compiler::cpp::FieldChunk_const&)>
                           (end._M_current,iStack_98._M_current,
                            cpp::anon_unknown_0::MayGroupChunksForHaswordsCheck);
      uVar1 = next._M_current._4_4_;
      local_c8._M_current = end._M_current;
      local_a8._M_current = local_d0._M_current;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"from.",(allocator<char> *)((long)&fields + 7));
      options = (Options *)(ulong)uVar1;
      bVar3 = cpp::anon_unknown_0::MaybeEmitHaswordsCheck
                        (local_c8,local_d0,&this->options_,&this->has_bit_indices_,uVar1,&local_f0,
                         (Printer *)
                         format.vars_.
                         super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         .
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         .settings_.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                         .value.heap_or_soo_.heap.slot_array);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&fields + 7));
      local_b9 = bVar3;
      while (bVar3 = __gnu_cxx::operator!=(&end,&local_a8), bVar3) {
        pFVar8 = __gnu_cxx::
                 __normal_iterator<google::protobuf::compiler::cpp::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>_>
                 ::operator->(&end);
        _chunk_mask = &pFVar8->fields;
        ppFVar9 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::front(_chunk_mask);
        iVar7 = HasByteIndex(this,*ppFVar9);
        absl_log_internal_check_op_result._7_1_ = iVar7 != -1;
        local_7b9 = 0;
        if ((bool)absl_log_internal_check_op_result._7_1_) {
          sVar10 = std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::size(_chunk_mask);
          local_7b9 = 0;
          if (1 < sVar10) {
            ppFVar9 = std::
                      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ::back(_chunk_mask);
            bVar3 = IsLikelyPresent(*ppFVar9,&this->options_);
            local_7b9 = bVar3 ^ 0xff;
          }
        }
        absl_log_internal_check_op_result._6_1_ = local_7b9 & 1;
        cpp::anon_unknown_0::DebugAssertUniformLikelyPresence(_chunk_mask,&this->options_);
        uVar1 = next._M_current._4_4_;
        if ((absl_log_internal_check_op_result._7_1_ & 1) != 0) {
          ppFVar9 = std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::front(_chunk_mask);
          uVar5 = HasWordIndex(this,*ppFVar9);
          if (uVar1 != uVar5) {
            ppFVar9 = std::
                      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ::front(_chunk_mask);
            next._M_current._4_4_ = HasWordIndex(this,*ppFVar9);
            Formatter::operator()
                      ((Formatter *)local_40,"cached_has_bits = from.$has_bits$[$1$];\n",
                       (int *)((long)&next._M_current + 4));
          }
        }
        if ((absl_log_internal_check_op_result._6_1_ & 1) != 0) {
          absl_log_internal_check_op_result._0_4_ =
               GenChunkMask(_chunk_mask,&this->has_bit_indices_);
          iVar7 = absl::lts_20250127::log_internal::GetReferenceableValue(2);
          iVar6 = cpp::anon_unknown_0::popcnt((uint32_t)absl_log_internal_check_op_result);
          iVar6 = absl::lts_20250127::log_internal::GetReferenceableValue(iVar6);
          local_110 = absl::lts_20250127::log_internal::Check_LEImpl
                                (iVar7,iVar6,"2 <= popcnt(chunk_mask)");
          if (local_110 != (Nullable<const_char_*>)0x0) {
            pcVar16 = absl::lts_20250127::implicit_cast<char_const*>(local_110);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                       ,0x10ee,pcVar16);
            pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                ((LogMessage *)&absl_log_internal_check_op_result_1);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_111,pLVar11);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
          }
          iVar7 = absl::lts_20250127::log_internal::GetReferenceableValue(8);
          iVar6 = cpp::anon_unknown_0::popcnt((uint32_t)absl_log_internal_check_op_result);
          iVar6 = absl::lts_20250127::log_internal::GetReferenceableValue(iVar6);
          local_130 = absl::lts_20250127::log_internal::Check_GEImpl
                                (iVar7,iVar6,"8 >= popcnt(chunk_mask)");
          if (local_130 != (Nullable<const_char_*>)0x0) {
            pcVar16 = absl::lts_20250127::implicit_cast<char_const*>(local_130);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_148,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                       ,0x10ef,pcVar16);
            pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_148);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_131,pLVar11);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_148);
          }
          cpp::(anonymous_namespace)::GenerateConditionMaybeWithProbabilityForGroup_abi_cxx11_
                    ((string *)&__range5,
                     (_anonymous_namespace_ *)(ulong)(uint32_t)absl_log_internal_check_op_result,
                     (uint32_t)_chunk_mask,
                     (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)&this->options_,options);
          Formatter::operator()
                    ((Formatter *)local_40,"if ($1$) {\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range5)
          ;
          std::__cxx11::string::~string((string *)&__range5);
          Formatter::Indent((Formatter *)local_40);
        }
        this_00 = _chunk_mask;
        __end5 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::begin(_chunk_mask);
        field = (FieldDescriptor *)
                std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::end(this_00);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                           *)&field), bVar3) {
          ppFVar12 = __gnu_cxx::
                     __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                     ::operator*(&__end5);
          generator = (FieldGenerator *)*ppFVar12;
          local_1c8._56_8_ =
               FieldGeneratorTable::get(&this->field_generators_,(FieldDescriptor *)generator);
          bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)generator);
          if (bVar3) {
            FieldGenerator::GenerateMergingCode
                      ((FieldGenerator *)local_1c8._56_8_,
                       (Printer *)
                       format.vars_.
                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_.heap.slot_array);
          }
          else {
            bVar3 = FieldDescriptor::is_required((FieldDescriptor *)generator);
            if (((bVar3) ||
                (bVar3 = FieldDescriptor::is_repeated((FieldDescriptor *)generator), bVar3)) ||
               (bVar3 = protobuf::internal::cpp::HasHasbit((FieldDescriptor *)generator),
               uVar2 = format.vars_.
                       super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .settings_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                       .value.heap_or_soo_.heap.slot_array, bVar3)) {
              this_01 = FieldDescriptor::options((FieldDescriptor *)generator);
              bVar3 = FieldOptions::weak(this_01);
              uVar1 = next._M_current._4_4_;
              if ((bVar3) ||
                 (pFVar13 = generator, uVar5 = HasWordIndex(this,(FieldDescriptor *)generator),
                 uVar1 != uVar5)) {
                uVar2 = format.vars_.
                        super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_.heap.slot_array;
                HasBitVars_abi_cxx11_(&local_208,this,(FieldDescriptor *)generator);
                protobuf::io::Printer::
                WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>,void,void>
                          ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
                            *)local_1e8,(Printer *)uVar2,&local_208);
                absl::lts_20250127::
                flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~flat_hash_map(&local_208);
                Formatter::operator()<>
                          ((Formatter *)local_40,
                           "if ((from.$has_bits$[$has_array_index$] & $has_mask$) != 0) {\n");
                Formatter::Indent((Formatter *)local_40);
                FieldGenerator::GenerateMergingCode
                          ((FieldGenerator *)local_1c8._56_8_,
                           (Printer *)
                           format.vars_.
                           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           .
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           .settings_.
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.heap_or_soo_.heap.slot_array);
                Formatter::Outdent((Formatter *)local_40);
                Formatter::operator()<>((Formatter *)local_40,"}\n");
                absl::lts_20250127::
                Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1039:28)>
                ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
                            *)local_1e8);
              }
              else {
                local_278[0x57] = 0;
                bVar3 = protobuf::internal::cpp::HasHasbit((FieldDescriptor *)generator);
                iVar7 = extraout_EDX;
                if (((bVar3 ^ 0xffU) & 1) != 0) {
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&has_bit_index,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                             ,0x1111,"HasHasbit(field)");
                  local_278[0x57] = 1;
                  pFVar13 = (FieldGenerator *)
                            absl::lts_20250127::log_internal::LogMessage::InternalStream
                                      ((LogMessage *)&has_bit_index);
                  absl::lts_20250127::log_internal::Voidify::operator&&
                            (&local_209,(LogMessage *)pFVar13);
                  iVar7 = extraout_EDX_00;
                }
                if ((local_278[0x57] & 1) != 0) {
                  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                            ((LogMessageFatal *)&has_bit_index);
                }
                pcVar16 = FieldDescriptor::index((FieldDescriptor *)generator,(char *)pFVar13,iVar7)
                ;
                puVar14 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                            (&this->has_bit_indices_,(long)(int)pcVar16);
                local_278._80_4_ = *puVar14;
                cpp::(anonymous_namespace)::GenerateConditionMaybeWithProbabilityForField_abi_cxx11_
                          ((string *)(local_278 + 0x30),
                           (_anonymous_namespace_ *)(ulong)(uint)local_278._80_4_,(int)generator,
                           (FieldDescriptor *)&this->options_,options);
                Formatter::operator()
                          ((Formatter *)local_40,"if ($1$) {\n",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_278 + 0x30));
                std::__cxx11::string::~string((string *)(local_278 + 0x30));
                Formatter::Indent((Formatter *)local_40);
                HVar4 = protobuf::internal::cpp::GetFieldHasbitMode((FieldDescriptor *)generator);
                uVar2 = format.vars_.
                        super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_.heap.slot_array;
                if (HVar4 == kHintHasbit) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)(local_278 + 0x20),
                             "from.");
                  pFVar13 = generator;
                  bVar3 = ShouldSplit((FieldDescriptor *)generator,&this->options_);
                  local_288.generator = (FieldGenerator *)local_1c8._56_8_;
                  local_288.p = (Printer **)
                                ((long)&format.vars_.
                                        super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        .
                                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        .settings_.
                                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                        .
                                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                                + 0x18);
                  absl::lts_20250127::AnyInvocable<void()>::
                  AnyInvocable<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__1,void>
                            ((AnyInvocable<void()> *)local_278,&local_288);
                  options = (Options *)(ulong)bVar3;
                  sVar18._M_str = (char *)pFVar13;
                  sVar18._M_len = local_278._40_8_;
                  cpp::anon_unknown_0::MayEmitMutableIfNonDefaultCheck
                            ((anon_unknown_0 *)uVar2,(Printer *)local_278._32_8_,sVar18,
                             (FieldDescriptor *)options,(bool)((char)this + '\x10'),
                             (Options *)local_278,
                             (AnyInvocable<void_()> *)((ulong)in_stack_fffffffffffff634 << 0x20),
                             (bool)in_stack_fffffffffffff638);
                  absl::lts_20250127::AnyInvocable<void_()>::~AnyInvocable
                            ((AnyInvocable<void_()> *)local_278);
                }
                else {
                  local_2a1 = 0;
                  HVar4 = protobuf::internal::cpp::GetFieldHasbitMode((FieldDescriptor *)generator);
                  if (HVar4 != kTrueHasbit) {
                    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                              ((LogMessageFatal *)&local_2a0,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                               ,0x111f,"GetFieldHasbitMode(field) == HasbitMode::kTrueHasbit");
                    local_2a1 = 1;
                    pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                        (&local_2a0);
                    absl::lts_20250127::log_internal::Voidify::operator&&(&local_289,pLVar11);
                  }
                  if ((local_2a1 & 1) != 0) {
                    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                              ((LogMessageFatal *)&local_2a0);
                  }
                  if (((absl_log_internal_check_op_result._6_1_ & 1) == 0) ||
                     (bVar3 = cpp::anon_unknown_0::IsPOD((FieldDescriptor *)generator), !bVar3)) {
                    FieldGenerator::GenerateMergingCode
                              ((FieldGenerator *)local_1c8._56_8_,
                               (Printer *)
                               format.vars_.
                               super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               .
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               .settings_.
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_.heap.slot_array);
                  }
                  else {
                    FieldGenerator::GenerateCopyConstructorCode
                              ((FieldGenerator *)local_1c8._56_8_,
                               (Printer *)
                               format.vars_.
                               super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               .
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               .settings_.
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_.heap.slot_array);
                  }
                }
                Formatter::Outdent((Formatter *)local_40);
                Formatter::operator()<>((Formatter *)local_40,"}\n");
              }
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)(local_1c8 + 0x28),
                         "from.");
              pFVar13 = generator;
              bVar3 = ShouldSplit((FieldDescriptor *)generator,&this->options_);
              v.storage_.callback_buffer_[0] = local_1c8[0x38];
              v.storage_.callback_buffer_[1] = local_1c8[0x39];
              v.storage_.callback_buffer_[2] = local_1c8[0x3a];
              v.storage_.callback_buffer_[3] = local_1c8[0x3b];
              v.storage_.callback_buffer_[4] = local_1c8[0x3c];
              v.storage_.callback_buffer_[5] = local_1c8[0x3d];
              v.storage_.callback_buffer_[6] = local_1c8[0x3e];
              v.storage_.callback_buffer_[7] = local_1c8[0x3f];
              absl::lts_20250127::AnyInvocable<void()>::
              AnyInvocable<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__0,void>
                        ((AnyInvocable<void()> *)local_1c8,
                         (anon_class_16_2_0454c2e6 *)v.storage_.callback_buffer_);
              options = (Options *)(ulong)bVar3;
              prefix._M_str = (char *)pFVar13;
              prefix._M_len = local_1c8._48_8_;
              cpp::anon_unknown_0::MayEmitMutableIfNonDefaultCheck
                        ((anon_unknown_0 *)uVar2,(Printer *)local_1c8._40_8_,prefix,
                         (FieldDescriptor *)options,(bool)((char)this + '\x10'),(Options *)local_1c8
                         ,(AnyInvocable<void_()> *)CONCAT44(in_stack_fffffffffffff634,1),
                         (bool)in_stack_fffffffffffff638);
              absl::lts_20250127::AnyInvocable<void_()>::~AnyInvocable
                        ((AnyInvocable<void_()> *)local_1c8);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
          ::operator++(&__end5);
        }
        if ((absl_log_internal_check_op_result._6_1_ & 1) != 0) {
          Formatter::Outdent((Formatter *)local_40);
          Formatter::operator()<>((Formatter *)local_40,"}\n");
        }
        __gnu_cxx::
        __normal_iterator<google::protobuf::compiler::cpp::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>_>
        ::operator++(&end);
      }
      if ((local_b9 & 1) != 0) {
        protobuf::io::Printer::Outdent
                  ((Printer *)
                   format.vars_.
                   super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   .
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.slot_array);
        uVar2 = format.vars_.
                super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                value.heap_or_soo_.heap.slot_array;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_2b8,"\n        }\n      ");
        protobuf::io::Printer::SourceLocation::current();
        protobuf::io::Printer::Emit((Printer *)uVar2,local_2b8._M_len,local_2b8._M_str);
        next._M_current._4_4_ = 0xffffffff;
      }
    }
    sVar15 = HasBitsSize(this);
    uVar2 = format.vars_.
            super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.slot_array;
    if (sVar15 == 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2d0,"\n      _this->$has_bits$[0] |= cached_has_bits;\n    ");
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit((Printer *)uVar2,local_2d0._M_len,local_2d0._M_str);
    }
    else {
      sVar15 = HasBitsSize(this);
      uVar2 = format.vars_.
              super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .heap_or_soo_.heap.slot_array;
      if (1 < sVar15) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_2e8,"\n      _this->$has_bits$.Or(from.$has_bits$);\n    ");
        protobuf::io::Printer::SourceLocation::current();
        protobuf::io::Printer::Emit((Printer *)uVar2,local_2e8._M_len,local_2e8._M_str);
      }
    }
    __begin3.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
    IVar17 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3.descriptor);
    __begin3._0_8_ = IVar17.descriptor;
    __end3.descriptor._0_4_ = IVar17.idx;
    IVar17 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3.descriptor);
    __end3._0_8_ = IVar17.descriptor;
    oneof._0_4_ = IVar17.idx;
    while( true ) {
      bVar3 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&oneof);
      if (!bVar3) break;
      local_328 = (undefined1  [8])
                  OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3.descriptor);
      uVar2 = format.vars_.
              super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .heap_or_soo_.heap.slot_array;
      local_729 = 1;
      local_630 = &local_628;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,"name",&local_651);
      sVar18 = OneofDescriptor::name((OneofDescriptor *)local_328);
      local_668 = sVar18;
      protobuf::io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
                (&local_628,&local_650,&local_668);
      local_630 = &local_570;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"NAME",&local_689);
      sVar18 = OneofDescriptor::name((OneofDescriptor *)local_328);
      s._M_len = sVar18._M_str;
      s._M_str = (char *)sVar18._M_len;
      local_6c0 = sVar18;
      absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_6b0,(lts_20250127 *)sVar18._M_len,s);
      protobuf::io::Printer::Sub::Sub<std::__cxx11::string>(&local_570,&local_688,&local_6b0);
      local_630 = &local_4b8;
      std::allocator<char>::allocator();
      pcVar16 = "index";
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"index",&local_6e1);
      pcVar16 = OneofDescriptor::index((OneofDescriptor *)local_328,pcVar16,__c);
      local_6e8 = (int)pcVar16;
      protobuf::io::Printer::Sub::Sub<int>(&local_4b8,&local_6e0,&local_6e8);
      local_630 = &local_400;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"cases",&local_709);
      local_728.oneof = (value_type *)local_328;
      local_728.p = (Printer **)
                    ((long)&format.vars_.
                            super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            .
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            .settings_.
                            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                            .
                            super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    + 0x18);
      local_728.this = this;
      protobuf::io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__3>
                (&local_400,&local_708,&local_728);
      local_729 = 0;
      local_348 = &local_628;
      local_340 = 4;
      v_00._M_len = 4;
      v_00._M_array = local_348;
      absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_338._M_local_buf,v_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_740,
                 "\n              if (const uint32_t oneof_from_case = from.$oneof_case$[$index$]) {\n                const uint32_t oneof_to_case = _this->$oneof_case$[$index$];\n                const bool oneof_needs_init = oneof_to_case != oneof_from_case;\n                if (oneof_needs_init) {\n                  if (oneof_to_case != 0) {\n                    _this->clear_$name$();\n                  }\n                  _this->$oneof_case$[$index$] = oneof_from_case;\n                }\n\n                switch (oneof_from_case) {\n                  $cases$;\n                  case $NAME$_NOT_SET:\n                    break;\n                }\n              }\n            "
                );
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit
                ((Printer *)uVar2,local_338._M_allocated_capacity,local_338._8_8_,local_740._M_len,
                 local_740._M_str);
      local_978 = (Sub *)&local_348;
      do {
        local_978 = local_978 + -1;
        protobuf::io::Printer::Sub::~Sub(local_978);
      } while (local_978 != &local_628);
      std::__cxx11::string::~string((string *)&local_708);
      std::allocator<char>::~allocator(&local_709);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::allocator<char>::~allocator(&local_6e1);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_688);
      std::allocator<char>::~allocator(&local_689);
      std::__cxx11::string::~string((string *)&local_650);
      std::allocator<char>::~allocator(&local_651);
      OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3.descriptor);
    }
    if (this->num_weak_fields_ != 0) {
      Formatter::operator()<>
                ((Formatter *)local_40,"_this->$weak_field_map$.MergeFrom(from.$weak_field_map$);\n"
                );
    }
    iVar7 = Descriptor::extension_range_count(this->descriptor_);
    uVar2 = format.vars_.
            super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            heap_or_soo_.heap.slot_array;
    if (0 < iVar7) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_758,
                 "\n      _this->$extensions$.MergeFrom(&default_instance(), from.$extensions$);\n    "
                );
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit((Printer *)uVar2,local_758._M_len,local_758._M_str);
    }
    Formatter::operator()<>
              ((Formatter *)local_40,
               "_this->_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n"
              );
    Formatter::Outdent((Formatter *)local_40);
    Formatter::operator()<>((Formatter *)local_40,"}\n");
    std::
    vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
    ::~vector((vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
               *)local_80);
    Formatter::~Formatter((Formatter *)local_40);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClassSpecificMergeImpl(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  // Generate the class-specific MergeFrom, which avoids the ABSL_CHECK and
  // cast.
  Formatter format(p);
  format(
      "void $classname$::MergeImpl($pb$::MessageLite& to_msg, const "
      "$pb$::MessageLite& from_msg) {\n"
      "$WeakDescriptorSelfPin$"
      "  auto* const _this = static_cast<$classname$*>(&to_msg);\n"
      "  auto& from = static_cast<const $classname$&>(from_msg);\n");
  format.Indent();
  if (RequiresArena(GeneratorFunction::kMergeFrom)) {
    p->Emit(R"cc(
      $pb$::Arena* arena = _this->GetArena();
    )cc");
  }
  format(
      "$annotate_mergefrom$"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n");
  format("$DCHK$_NE(&from, _this);\n");

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  if (ShouldSplit(descriptor_, options_)) {
    format(
        "if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {\n"
        "  _this->PrepareSplitMessageForWrite();\n"
        "}\n");
  }

  std::vector<FieldChunk> chunks = CollectFields(
      optimized_order_, options_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return HasByteIndex(a) == HasByteIndex(b) &&
               IsLikelyPresent(a, options_) == IsLikelyPresent(b, options_) &&
               ShouldSplit(a, options_) == ShouldSplit(b, options_);
      });

  auto it = chunks.begin();
  auto end = chunks.end();
  // cached_has_word_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_word_index]
  // for cached_has_word_index >= 0
  int cached_has_word_index = -1;
  while (it != end) {
    auto next = FindNextUnequalChunk(it, end, MayGroupChunksForHaswordsCheck);
    bool has_haswords_check =
        MaybeEmitHaswordsCheck(it, next, options_, has_bit_indices_,
                               cached_has_word_index, "from.", p);

    while (it != next) {
      const std::vector<const FieldDescriptor*>& fields = it->fields;
      const bool cache_has_bits = HasByteIndex(fields.front()) != kNoHasbit;
      const bool check_has_byte = cache_has_bits && fields.size() > 1 &&
                                  !IsLikelyPresent(fields.back(), options_);

      DebugAssertUniformLikelyPresence(fields, options_);

      if (cache_has_bits &&
          cached_has_word_index != HasWordIndex(fields.front())) {
        cached_has_word_index = HasWordIndex(fields.front());
        format("cached_has_bits = from.$has_bits$[$1$];\n",
               cached_has_word_index);
      }

      if (check_has_byte) {
        // Emit an if() that will let us skip the whole chunk if none are set.
        uint32_t chunk_mask = GenChunkMask(fields, has_bit_indices_);

        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        ABSL_DCHECK_LE(2, popcnt(chunk_mask));
        ABSL_DCHECK_GE(8, popcnt(chunk_mask));

        format("if ($1$) {\n", GenerateConditionMaybeWithProbabilityForGroup(
                                   chunk_mask, fields, options_));
        format.Indent();
      }

      // Go back and emit merging code for each of the fields we processed.
      for (const auto* field : fields) {
        const auto& generator = field_generators_.get(field);

        if (field->is_repeated()) {
          generator.GenerateMergingCode(p);
        } else if (!field->is_required() && !field->is_repeated() &&
                   !HasHasbit(field)) {
          // Merge semantics without true field presence: primitive fields are
          // merged only if non-zero (numeric) or non-empty (string).
          MayEmitMutableIfNonDefaultCheck(
              p, "from.", field, ShouldSplit(field, options_), options_,
              /*emit_body=*/[&]() { generator.GenerateMergingCode(p); },
              /*with_enclosing_braces_always=*/true);
        } else if (field->options().weak() ||
                   cached_has_word_index != HasWordIndex(field)) {
          // Check hasbit, not using cached bits.
          auto v = p->WithVars(HasBitVars(field));
          format(
              "if ((from.$has_bits$[$has_array_index$] & $has_mask$) != 0) "
              "{\n");
          format.Indent();
          generator.GenerateMergingCode(p);
          format.Outdent();
          format("}\n");
        } else {
          // Check hasbit, using cached bits.
          ABSL_CHECK(HasHasbit(field));
          int has_bit_index = has_bit_indices_[field->index()];
          format("if ($1$) {\n", GenerateConditionMaybeWithProbabilityForField(
                                     has_bit_index, field, options_));
          format.Indent();

          if (GetFieldHasbitMode(field) == HasbitMode::kHintHasbit) {
            // Merge semantics without true field presence: primitive fields are
            // merged only if non-zero (numeric) or non-empty (string).
            MayEmitMutableIfNonDefaultCheck(
                p, "from.", field, ShouldSplit(field, options_), options_,
                /*emit_body=*/[&]() { generator.GenerateMergingCode(p); },
                /*with_enclosing_braces_always=*/false);
          } else {
            ABSL_DCHECK(GetFieldHasbitMode(field) == HasbitMode::kTrueHasbit);
            if (check_has_byte && IsPOD(field)) {
              generator.GenerateCopyConstructorCode(p);
            } else {
              generator.GenerateMergingCode(p);
            }
          }

          format.Outdent();
          format("}\n");
        }
      }

      if (check_has_byte) {
        format.Outdent();
        format("}\n");
      }

      // To next chunk.
      ++it;
    }

    if (has_haswords_check) {
      p->Outdent();
      p->Emit(R"cc(
        }
      )cc");

      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  if (HasBitsSize() == 1) {
    // Optimization to avoid a load. Assuming that most messages have fewer than
    // 32 fields, this seems useful.
    p->Emit(R"cc(
      _this->$has_bits$[0] |= cached_has_bits;
    )cc");
  } else if (HasBitsSize() > 1) {
    p->Emit(R"cc(
      _this->$has_bits$.Or(from.$has_bits$);
    )cc");
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (auto oneof : OneOfRange(descriptor_)) {
    p->Emit({{"name", oneof->name()},
             {"NAME", absl::AsciiStrToUpper(oneof->name())},
             {"index", oneof->index()},
             {"cases",
              [&] {
                for (const auto* field : FieldRange(oneof)) {
                  p->Emit(
                      {{"Label", UnderscoresToCamelCase(field->name(), true)},
                       {"body",
                        [&] {
                          field_generators_.get(field).GenerateMergingCode(p);
                        }}},
                      R"cc(
                        case k$Label$: {
                          $body$;
                          break;
                        }
                      )cc");
                }
              }}},
            R"cc(
              if (const uint32_t oneof_from_case = from.$oneof_case$[$index$]) {
                const uint32_t oneof_to_case = _this->$oneof_case$[$index$];
                const bool oneof_needs_init = oneof_to_case != oneof_from_case;
                if (oneof_needs_init) {
                  if (oneof_to_case != 0) {
                    _this->clear_$name$();
                  }
                  _this->$oneof_case$[$index$] = oneof_from_case;
                }

                switch (oneof_from_case) {
                  $cases$;
                  case $NAME$_NOT_SET:
                    break;
                }
              }
            )cc");
  }
  if (num_weak_fields_) {
    format(
        "_this->$weak_field_map$.MergeFrom(from.$weak_field_map$);"
        "\n");
  }

  // Merging of extensions and unknown fields is done last, to maximize
  // the opportunity for tail calls.
  if (descriptor_->extension_range_count() > 0) {
    p->Emit(R"cc(
      _this->$extensions$.MergeFrom(&default_instance(), from.$extensions$);
    )cc");
  }

  format(
      "_this->_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._"
      "internal_"
      "metadata_);\n");

  format.Outdent();
  format("}\n");
}